

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_art_index.cpp
# Opt level: O0

SinkResultType __thiscall
duckdb::PhysicalCreateARTIndex::SinkSorted(PhysicalCreateARTIndex *this,OperatorSinkInput *input)

{
  bool bVar1;
  int iVar2;
  CreateARTIndexLocalSinkState *args_1;
  vector<unsigned_long,_true> *args_2;
  pointer pBVar3;
  ART *pAVar4;
  undefined8 uVar5;
  type other_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  AttachedDatabase *in_stack_00000010;
  shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
  *in_stack_00000018;
  templated_unique_single_t art;
  unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true> *l_index;
  DataTable *storage;
  CreateARTIndexLocalSinkState *l_state;
  string *msg;
  Index *in_stack_fffffffffffffec0;
  shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
  *this_00;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  unsafe_vector<ARTKey> *in_stack_fffffffffffffee8;
  unsafe_vector<ARTKey> *in_stack_fffffffffffffef0;
  ART *in_stack_fffffffffffffef8;
  allocator local_91;
  string local_90 [38];
  undefined1 local_6a;
  allocator local_69;
  string local_68 [55];
  undefined1 local_31;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_ffffffffffffffd0;
  unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true> *args_3;
  
  args_1 = LocalSinkState::Cast<duckdb::CreateARTIndexLocalSinkState>
                     ((LocalSinkState *)in_stack_fffffffffffffec0);
  args_2 = (vector<unsigned_long,_true> *)(**(code **)(**(long **)(in_RDI + 0x80) + 0x80))();
  args_3 = &args_1->local_index;
  unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
  operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
              *)in_stack_fffffffffffffec0);
  pBVar3 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
                     ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                       *)in_stack_fffffffffffffec0);
  iVar2 = (*(pBVar3->super_Index)._vptr_Index[5])();
  local_31 = (undefined1)iVar2;
  pBVar3 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
                     ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                       *)in_stack_fffffffffffffec0);
  Index::GetColumnIds(&pBVar3->super_Index);
  unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
            ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true> *)
             in_stack_fffffffffffffec0);
  unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
            ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true> *)
             in_stack_fffffffffffffec0);
  msg = (string *)
        (args_2->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
            ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true> *)
             in_stack_fffffffffffffec0);
  pAVar4 = Index::Cast<duckdb::ART>(in_stack_fffffffffffffec0);
  this_00 = &pAVar4->allocators;
  make_uniq<duckdb::ART,std::__cxx11::string&,duckdb::IndexConstraintType,duckdb::vector<unsigned_long,true>const&,duckdb::TableIOManager&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&,duckdb::AttachedDatabase&,duckdb::shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,std::default_delete<duckdb::FixedSizeAllocator>,false>,9ul>,true>&>
            (in_RSI,(IndexConstraintType *)args_1,args_2,(TableIOManager *)args_3,
             in_stack_ffffffffffffffd0,in_stack_00000010,in_stack_00000018);
  unique_ptr<duckdb::ART,_std::default_delete<duckdb::ART>,_true>::operator->
            ((unique_ptr<duckdb::ART,_std::default_delete<duckdb::ART>,_true> *)this_00);
  DataChunk::size(&args_1->key_chunk);
  bVar1 = ART::Construct(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                         in_stack_fffffffffffffee8,
                         CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  if (!bVar1) {
    local_6a = 1;
    uVar5 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_68,"Data contains duplicates on indexed column(s)",&local_69);
    ConstraintException::ConstraintException((ConstraintException *)this_00,msg);
    local_6a = 0;
    __cxa_throw(uVar5,&ConstraintException::typeinfo,ConstraintException::~ConstraintException);
  }
  pBVar3 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
                     ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                       *)this_00);
  other_index = unique_ptr<duckdb::ART,_std::default_delete<duckdb::ART>,_true>::operator*
                          ((unique_ptr<duckdb::ART,_std::default_delete<duckdb::ART>,_true> *)
                           this_00);
  bVar1 = BoundIndex::MergeIndexes(pBVar3,&other_index->super_BoundIndex);
  if (!bVar1) {
    uVar5 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_90,"Data contains duplicates on indexed column(s)",&local_91);
    ConstraintException::ConstraintException((ConstraintException *)this_00,msg);
    __cxa_throw(uVar5,&ConstraintException::typeinfo,ConstraintException::~ConstraintException);
  }
  unique_ptr<duckdb::ART,_std::default_delete<duckdb::ART>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ART,_std::default_delete<duckdb::ART>,_true> *)0x18bbb71);
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalCreateARTIndex::SinkSorted(OperatorSinkInput &input) const {

	auto &l_state = input.local_state.Cast<CreateARTIndexLocalSinkState>();
	auto &storage = table.GetStorage();
	auto &l_index = l_state.local_index;

	// Construct an ART for this chunk.
	auto art = make_uniq<ART>(info->index_name, l_index->GetConstraintType(), l_index->GetColumnIds(),
	                          l_index->table_io_manager, l_index->unbound_expressions, storage.db,
	                          l_index->Cast<ART>().allocators);
	if (!art->Construct(l_state.keys, l_state.row_ids, l_state.key_chunk.size())) {
		throw ConstraintException("Data contains duplicates on indexed column(s)");
	}

	// Merge the ART into the local ART.
	if (!l_index->MergeIndexes(*art)) {
		throw ConstraintException("Data contains duplicates on indexed column(s)");
	}

	return SinkResultType::NEED_MORE_INPUT;
}